

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_init_infill(llama_vocab *vocab)

{
  undefined8 *ctx;
  llama_sampler *plVar1;
  allocator_type local_1a;
  allocator_type local_19;
  
  ctx = (undefined8 *)operator_new(0x38);
  *ctx = vocab;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)(ctx + 1),0x200,&local_19);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)(ctx + 4),0x200,&local_1a);
  plVar1 = llama_sampler_init(&llama_sampler_infill_i,ctx);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_infill(const struct llama_vocab * vocab) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_infill_i,
        /* .ctx   = */ new llama_sampler_infill {
            /* .vocab = */ vocab,
            /* .buf0  = */ std::vector<char>(512),
            /* .buf1  = */ std::vector<char>(512),
        }
    );
}